

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

QList<MakefileGenerator::SubTarget_*> * __thiscall
MakefileGenerator::findSubDirsSubTargets(MakefileGenerator *this)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  QList<ProString> *this_00;
  qsizetype qVar4;
  QString *this_01;
  char *pcVar5;
  ulong uVar6;
  QList<MakefileGenerator::SubTarget_*> *in_RDI;
  long in_FS_OFFSET;
  int subDep;
  bool found;
  int depend;
  ProStringList *depends;
  int new_slsh;
  int slsh;
  bool fromFile;
  SubTarget *st;
  int subdir;
  ProStringList *subdirs;
  QList<MakefileGenerator::SubTarget_*> *targets;
  ProKey tkey;
  QString depend_str;
  ProKey dskey;
  ProKey dfkey;
  QString d;
  ProKey dtkey;
  QString fixedSubDep;
  QString subName;
  ProKey dkey;
  QString basename;
  ProKey mkey;
  QString baseName;
  QString file;
  ProKey skey;
  ProKey fkey;
  QString fixedSubdir;
  QString oname;
  ProString ofile;
  parameter_type in_stack_fffffffffffff6c8;
  QMakeProject *in_stack_fffffffffffff6d0;
  QMakeProject *in_stack_fffffffffffff6d8;
  ProString *in_stack_fffffffffffff6e0;
  QMakeProject *in_stack_fffffffffffff6e8;
  ProString *in_stack_fffffffffffff6f0;
  ProString *in_stack_fffffffffffff6f8;
  undefined7 in_stack_fffffffffffff700;
  byte in_stack_fffffffffffff707;
  QString *in_stack_fffffffffffff708;
  byte local_8d9;
  int local_89c;
  int local_894;
  QList<ProString> *in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff778;
  int in_stack_fffffffffffff77c;
  int in_stack_fffffffffffff780;
  uint in_stack_fffffffffffff784;
  bool local_871;
  int local_864;
  uint local_824;
  undefined1 local_820 [24];
  QRegularExpression local_808 [8];
  QStringBuilder<const_char_(&)[5],_QString_&> local_800;
  QStringBuilder<QString_&,_const_char_(&)[8]> local_790;
  undefined1 local_780 [76];
  uint local_734;
  undefined1 local_730 [24];
  QRegularExpression local_718 [56];
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  uint local_6ac;
  undefined1 local_6a8 [24];
  QRegularExpression local_690 [8];
  QStringBuilder<const_char_(&)[5],_QString_&> local_688;
  QStringBuilder<QString_&,_const_char_(&)[8]> local_600;
  undefined1 local_5f0 [120];
  QStringBuilder<QString_&,_const_char_(&)[6]> local_578;
  undefined1 local_568 [48];
  undefined8 local_538;
  undefined8 local_530;
  undefined8 local_528;
  QStringBuilder<QString_&,_const_char_(&)[8]> local_4f0;
  undefined1 local_4e0 [76];
  uint local_494;
  undefined1 local_490 [24];
  QRegularExpression local_478 [8];
  undefined8 local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 local_448;
  QStringBuilder<QString_&,_const_char_(&)[9]> local_440;
  undefined1 local_430 [92];
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_fffffffffffffc2c;
  undefined1 local_3a0 [24];
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  QStringBuilder<QString_&,_const_char_(&)[10]> local_328;
  undefined1 local_318 [104];
  QFileInfo local_2b0 [8];
  QStringBuilder<const_QString_&,_QString_&> local_2a8;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined1 local_230 [72];
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  QStringBuilder<QString_&,_const_char_(&)[8]> local_158;
  undefined1 local_148 [48];
  QStringBuilder<QString_&,_const_char_(&)[6]> local_118;
  undefined1 local_108 [76];
  uint local_bc;
  undefined1 local_b8 [24];
  QRegularExpression local_a0 [8];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (SubTarget **)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QList<MakefileGenerator::SubTarget_*>::QList((QList<MakefileGenerator::SubTarget_*> *)0x198cc6);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff6d0,(char *)in_stack_fffffffffffff6c8);
  this_00 = &QMakeProject::values(in_stack_fffffffffffff6d0,(ProKey *)in_stack_fffffffffffff6c8)->
             super_QList<ProString>;
  ProKey::~ProKey((ProKey *)0x198d2d);
  local_864 = 0;
  do {
    qVar4 = QList<ProString>::size(this_00);
    if (qVar4 <= local_864) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return in_RDI;
    }
    memset(local_68,0xaa,0x30);
    QList<ProString>::operator[]
              ((QList<ProString> *)in_stack_fffffffffffff6d0,(qsizetype)in_stack_fffffffffffff6c8);
    ProString::ProString
              ((ProString *)in_stack_fffffffffffff6d0,(ProString *)in_stack_fffffffffffff6c8);
    local_80 = 0xaaaaaaaaaaaaaaaa;
    local_78 = 0xaaaaaaaaaaaaaaaa;
    local_70 = 0xaaaaaaaaaaaaaaaa;
    ProString::toQString((ProString *)in_stack_fffffffffffff6c8);
    local_98 = 0xaaaaaaaaaaaaaaaa;
    local_90 = 0xaaaaaaaaaaaaaaaa;
    local_88 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name);
    QString::QString((QString *)in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff708);
    QFlags<QRegularExpression::PatternOption>::QFlags
              ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffff6d0,
               (PatternOption)((ulong)in_stack_fffffffffffff6c8 >> 0x20));
    QRegularExpression::QRegularExpression
              (local_a0,(QString *)local_b8,(QFlags_conflict *)(ulong)local_bc);
    QString::QString((QString *)in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff708);
    QString::replace((QRegularExpression *)&local_98,(QString *)local_a0);
    QString::~QString((QString *)0x198eb0);
    QRegularExpression::~QRegularExpression(local_a0);
    QString::~QString((QString *)0x198eca);
    this_01 = (QString *)operator_new(0xa8);
    SubTarget::SubTarget((SubTarget *)in_stack_fffffffffffff6d0);
    QString::operator=(this_01,(QString *)&local_80);
    QList<MakefileGenerator::SubTarget_*>::append
              ((QList<MakefileGenerator::SubTarget_*> *)0x198f15,in_stack_fffffffffffff6c8);
    memset(local_108,0xaa,0x30);
    local_118 = ::operator+((QString *)in_stack_fffffffffffff6d0,
                            (char (*) [6])in_stack_fffffffffffff6c8);
    ProKey::ProKey<QString&,char_const(&)[6]>
              ((ProKey *)in_stack_fffffffffffff6d0,
               (QStringBuilder<QString_&,_const_char_(&)[6]> *)in_stack_fffffffffffff6c8);
    memset(local_148,0xaa,0x30);
    local_158 = ::operator+((QString *)in_stack_fffffffffffff6d0,
                            (char (*) [8])in_stack_fffffffffffff6c8);
    ProKey::ProKey<QString&,char_const(&)[8]>
              ((ProKey *)in_stack_fffffffffffff6d0,
               (QStringBuilder<QString_&,_const_char_(&)[8]> *)in_stack_fffffffffffff6c8);
    bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff6e8,(ProKey *)in_stack_fffffffffffff6e0);
    if (bVar1) {
      bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff6e8,(ProKey *)in_stack_fffffffffffff6e0);
      if (bVar1) {
        local_871 = ProString::endsWith(in_stack_fffffffffffff6e0,
                                        (QString *)in_stack_fffffffffffff6d8,
                                        (CaseSensitivity)((ulong)in_stack_fffffffffffff6d0 >> 0x20))
        ;
      }
      else {
        QMakeEvaluator::first
                  (&in_stack_fffffffffffff6e8->super_QMakeEvaluator,
                   (ProKey *)in_stack_fffffffffffff6e0);
        ProString::operator=
                  ((ProString *)in_stack_fffffffffffff6d0,(ProString *)in_stack_fffffffffffff6c8);
        ProString::~ProString((ProString *)0x19910f);
        local_871 = false;
      }
    }
    else {
      bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff6e8,(ProKey *)in_stack_fffffffffffff6e0);
      if (!bVar1) {
        QList<ProString>::operator[]
                  ((QList<ProString> *)in_stack_fffffffffffff6d0,
                   (qsizetype)in_stack_fffffffffffff6c8);
        ProString::toLatin1((ProString *)in_stack_fffffffffffff6e8);
        pcVar5 = QByteArray::constData((QByteArray *)0x199033);
        warn_msg(WarnLogic,"Cannot assign both file and subdir for subdir %s",pcVar5);
        QByteArray::~QByteArray((QByteArray *)0x199056);
      }
      QMakeEvaluator::first
                (&in_stack_fffffffffffff6e8->super_QMakeEvaluator,
                 (ProKey *)in_stack_fffffffffffff6e0);
      ProString::operator=
                ((ProString *)in_stack_fffffffffffff6d0,(ProString *)in_stack_fffffffffffff6c8);
      ProString::~ProString((ProString *)0x19909c);
      local_871 = true;
    }
    local_1e8 = 0xaaaaaaaaaaaaaaaa;
    local_1e0 = 0xaaaaaaaaaaaaaaaa;
    local_1d8 = 0xaaaaaaaaaaaaaaaa;
    ProString::toQString((ProString *)in_stack_fffffffffffff6c8);
    Option::fixPathToTargetOS
              ((QString *)in_stack_fffffffffffff6e8,
               SUB81((ulong)in_stack_fffffffffffff6e0 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffff6e0 >> 0x30,0));
    QString::~QString((QString *)0x1991a8);
    if (local_871 == false) {
      bVar1 = QString::isEmpty((QString *)0x1992a8);
      in_stack_fffffffffffff784 = in_stack_fffffffffffff784 & 0xffffff;
      local_8d9 = 0;
      if (!bVar1) {
        QString::QString((QString *)in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff708);
        in_stack_fffffffffffff784 = CONCAT13(1,(int3)in_stack_fffffffffffff784);
        bVar1 = QMakeProject::isActiveConfig
                          (in_stack_fffffffffffff6d8,(QString *)in_stack_fffffffffffff6d0,
                           SUB81((ulong)in_stack_fffffffffffff6c8 >> 0x38,0));
        local_8d9 = bVar1 ^ 0xff;
      }
      if ((in_stack_fffffffffffff784 & 0x1000000) != 0) {
        QString::~QString((QString *)0x199328);
      }
      if ((local_8d9 & 1) == 0) {
LAB_0019949e:
        QString::operator=(this_01 + 1,(QString *)&local_1e8);
        goto LAB_001994b9;
      }
      local_260 = 0xaaaaaaaaaaaaaaaa;
      local_258 = 0xaaaaaaaaaaaaaaaa;
      local_250 = 0xaaaaaaaaaaaaaaaa;
      QFlags<QString::SectionFlag>::QFlags
                ((QFlags<QString::SectionFlag> *)in_stack_fffffffffffff6d0,
                 (SectionFlag)((ulong)in_stack_fffffffffffff6c8 >> 0x20));
      QString::section((QString *)&local_260,(longlong)&local_1e8,0x3bdbd8,
                       (QFlags_conflict *)0xffffffffffffffff);
      bVar1 = QString::isEmpty((QString *)0x1993ac);
      if (bVar1) {
        QList<ProString>::operator[]
                  ((QList<ProString> *)in_stack_fffffffffffff6d0,
                   (qsizetype)in_stack_fffffffffffff6c8);
        ProString::toLatin1((ProString *)in_stack_fffffffffffff6e8);
        pcVar5 = QByteArray::constData((QByteArray *)0x1993e4);
        warn_msg(WarnLogic,"Ignoring invalid SUBDIRS entry %s",pcVar5);
        QByteArray::~QByteArray((QByteArray *)0x199407);
        in_stack_fffffffffffff780 = 4;
      }
      else {
        local_2a8 = ::operator+((QString *)in_stack_fffffffffffff6d0,
                                &in_stack_fffffffffffff6c8->name);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<const_QString_&,_QString_&> *)in_stack_fffffffffffff6c8);
        QString::operator=((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name);
        QString::~QString((QString *)0x199473);
        in_stack_fffffffffffff780 = 0;
      }
      QString::~QString((QString *)0x19948b);
      if (in_stack_fffffffffffff780 == 0) goto LAB_0019949e;
    }
    else {
      qVar4 = QString::lastIndexOf
                        (&in_stack_fffffffffffff6e0->m_string,(QString *)in_stack_fffffffffffff6d8,
                         (CaseSensitivity)((ulong)in_stack_fffffffffffff6d0 >> 0x20));
      if ((int)qVar4 == -1) {
        QString::operator=(this_01 + 3,(QString *)&local_1e8);
      }
      else {
        QString::left((QString *)in_stack_fffffffffffff6e8,(qsizetype)in_stack_fffffffffffff6e0);
        QString::operator=((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name);
        QString::~QString((QString *)0x19922c);
        QString::mid((longlong)local_230,(longlong)&local_1e8);
        QString::operator=((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name);
        QString::~QString((QString *)0x19927b);
      }
LAB_001994b9:
      while (uVar6 = QString::endsWith((QString *)(this_01 + 1),0x3bdbd8), (uVar6 & 1) != 0) {
        QString::chop((longlong)(this_01 + 1));
      }
      QString::QString((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name);
      fileInfo((MakefileGenerator *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
               &in_stack_fffffffffffff6f8->m_string);
      bVar2 = QFileInfo::isRelative();
      QFileInfo::~QFileInfo(local_2b0);
      QString::~QString((QString *)0x199555);
      if ((bVar2 & 1) == 0) {
        in_stack_fffffffffffff708 = this_01 + 1;
        QFlags<MakefileGenerator::FileFixifyType>::QFlags
                  ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffff6d0,
                   (FileFixifyType)((ulong)in_stack_fffffffffffff6c8 >> 0x20));
        fileFixify((MakefileGenerator *)
                   CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                   (QString *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
                   (FileFixifyTypes)in_stack_fffffffffffffc2c.i,
                   SUB81((ulong)in_stack_fffffffffffff770 >> 0x38,0));
        QString::operator=((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name);
        QString::~QString((QString *)0x1995ee);
      }
      else {
        QString::operator=(this_01 + 2,(QString *)(this_01 + 1));
      }
      memset(local_318,0xaa,0x30);
      local_328 = ::operator+((QString *)in_stack_fffffffffffff6d0,
                              (char (*) [10])in_stack_fffffffffffff6c8);
      ProKey::ProKey<QString&,char_const(&)[10]>
                ((ProKey *)in_stack_fffffffffffff6d0,
                 (QStringBuilder<QString_&,_const_char_(&)[10]> *)in_stack_fffffffffffff6c8);
      bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff6e8,(ProKey *)in_stack_fffffffffffff6e0);
      if (bVar1) {
        QString::operator=((QString *)in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6f8);
        bVar1 = QString::isEmpty((QString *)0x1996f8);
        if (!bVar1) {
          local_388 = 0xaaaaaaaaaaaaaaaa;
          local_380 = 0xaaaaaaaaaaaaaaaa;
          local_378 = 0xaaaaaaaaaaaaaaaa;
          QString::QString((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name);
          qVar4 = QString::lastIndexOf
                            (&in_stack_fffffffffffff6e0->m_string,
                             (QString *)in_stack_fffffffffffff6d8,
                             (CaseSensitivity)((ulong)in_stack_fffffffffffff6d0 >> 0x20));
          in_stack_fffffffffffff77c = (int)qVar4;
          if (in_stack_fffffffffffff77c != -1) {
            QString::mid((longlong)local_3a0,(longlong)&local_388);
            QString::operator=((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name
                              );
            QString::~QString((QString *)0x1997bb);
          }
          in_stack_fffffffffffff6f8 = (ProString *)(this_01 + 3);
          ::operator+((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QString_&,_QString_&> *)in_stack_fffffffffffff6c8);
          in_stack_fffffffffffff707 =
               ::operator!=((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name);
          QString::~QString((QString *)0x199828);
          if ((in_stack_fffffffffffff707 & 1) != 0) {
            in_stack_fffffffffffff6f0 = (ProString *)(this_01 + 3);
            in_stack_fffffffffffff6e8 = (QMakeProject *)QString::size(this_01 + 3);
            QString::size(&Option::pro_ext);
            QString::left((QString *)in_stack_fffffffffffff6e8,(qsizetype)in_stack_fffffffffffff6e0)
            ;
            ::operator+((char (*) [2])in_stack_fffffffffffff6d8,(QString *)in_stack_fffffffffffff6d0
                       );
            ::operator+=((QString *)CONCAT17(in_stack_fffffffffffff707,in_stack_fffffffffffff700),
                         (QStringBuilder<const_char_(&)[2],_QString> *)in_stack_fffffffffffff6f8);
            QStringBuilder<const_char_(&)[2],_QString>::~QStringBuilder
                      ((QStringBuilder<const_char_(&)[2],_QString> *)0x1998c4);
            QString::~QString((QString *)0x1998d1);
          }
          QString::~QString((QString *)0x1998de);
        }
      }
      else {
        QMakeEvaluator::first
                  (&in_stack_fffffffffffff6e8->super_QMakeEvaluator,
                   (ProKey *)in_stack_fffffffffffff6e0);
        ProString::toQString((ProString *)in_stack_fffffffffffff6c8);
        QString::operator=((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name);
        QString::~QString((QString *)0x1996bd);
        ProString::~ProString((ProString *)0x1996ca);
      }
      memset(local_430,0xaa,0x30);
      local_440 = ::operator+((QString *)in_stack_fffffffffffff6d0,
                              (char (*) [9])in_stack_fffffffffffff6c8);
      ProKey::ProKey<QString&,char_const(&)[9]>
                ((ProKey *)in_stack_fffffffffffff6d0,
                 (QStringBuilder<QString_&,_const_char_(&)[9]> *)in_stack_fffffffffffff6c8);
      bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff6e8,(ProKey *)in_stack_fffffffffffff6e0);
      if (!bVar1) {
        in_stack_fffffffffffff770 =
             &QMakeProject::values(in_stack_fffffffffffff6d0,(ProKey *)in_stack_fffffffffffff6c8)->
              super_QList<ProString>;
        local_894 = 0;
        while( true ) {
          in_stack_fffffffffffff6e0 = (ProString *)(long)local_894;
          qVar4 = QList<ProString>::size(in_stack_fffffffffffff770);
          if (qVar4 <= (long)in_stack_fffffffffffff6e0) break;
          bVar1 = false;
          local_89c = 0;
          while( true ) {
            in_stack_fffffffffffff6d8 = (QMakeProject *)(long)local_89c;
            qVar4 = QList<ProString>::size(this_00);
            if (qVar4 <= (long)in_stack_fffffffffffff6d8) break;
            in_stack_fffffffffffff6d0 =
                 (QMakeProject *)
                 QList<ProString>::operator[]
                           ((QList<ProString> *)in_stack_fffffffffffff6d0,
                            (qsizetype)in_stack_fffffffffffff6c8);
            QList<ProString>::at
                      ((QList<ProString> *)in_stack_fffffffffffff6d0,
                       (qsizetype)in_stack_fffffffffffff6c8);
            bVar3 = ProString::operator==(in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
            if (bVar3) {
              local_458 = 0xaaaaaaaaaaaaaaaa;
              local_450 = 0xaaaaaaaaaaaaaaaa;
              local_448 = 0xaaaaaaaaaaaaaaaa;
              QList<ProString>::operator[]
                        ((QList<ProString> *)in_stack_fffffffffffff6d0,
                         (qsizetype)in_stack_fffffffffffff6c8);
              ProString::toQString((ProString *)in_stack_fffffffffffff6c8);
              local_470 = 0xaaaaaaaaaaaaaaaa;
              local_468 = 0xaaaaaaaaaaaaaaaa;
              local_460 = 0xaaaaaaaaaaaaaaaa;
              QString::QString((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name
                              );
              QString::QString((QString *)in_stack_fffffffffffff6d8,
                               (char *)in_stack_fffffffffffff708);
              QFlags<QRegularExpression::PatternOption>::QFlags
                        ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffff6d0,
                         (PatternOption)((ulong)in_stack_fffffffffffff6c8 >> 0x20));
              QRegularExpression::QRegularExpression
                        (local_478,(QString *)local_490,(QFlags_conflict *)(ulong)local_494);
              QString::QString((QString *)in_stack_fffffffffffff6d8,
                               (char *)in_stack_fffffffffffff708);
              QString::replace((QRegularExpression *)&local_470,(QString *)local_478);
              QString::~QString((QString *)0x199b54);
              QRegularExpression::~QRegularExpression(local_478);
              QString::~QString((QString *)0x199b6e);
              memset(local_4e0,0xaa,0x30);
              local_4f0 = ::operator+((QString *)in_stack_fffffffffffff6d0,
                                      (char (*) [8])in_stack_fffffffffffff6c8);
              ProKey::ProKey<QString&,char_const(&)[8]>
                        ((ProKey *)in_stack_fffffffffffff6d0,
                         (QStringBuilder<QString_&,_const_char_(&)[8]> *)in_stack_fffffffffffff6c8);
              bVar1 = QMakeProject::isEmpty
                                (in_stack_fffffffffffff6e8,(ProKey *)in_stack_fffffffffffff6e0);
              if (bVar1) {
                local_538 = 0xaaaaaaaaaaaaaaaa;
                local_530 = 0xaaaaaaaaaaaaaaaa;
                local_528 = 0xaaaaaaaaaaaaaaaa;
                Option::fixPathToTargetOS
                          ((QString *)in_stack_fffffffffffff6e8,
                           SUB81((ulong)in_stack_fffffffffffff6e0 >> 0x38,0),
                           SUB81((ulong)in_stack_fffffffffffff6e0 >> 0x30,0));
                memset(local_568,0xaa,0x30);
                local_578 = ::operator+((QString *)in_stack_fffffffffffff6d0,
                                        (char (*) [6])in_stack_fffffffffffff6c8);
                ProKey::ProKey<QString&,char_const(&)[6]>
                          ((ProKey *)in_stack_fffffffffffff6d0,
                           (QStringBuilder<QString_&,_const_char_(&)[6]> *)in_stack_fffffffffffff6c8
                          );
                bVar1 = QMakeProject::isEmpty
                                  (in_stack_fffffffffffff6e8,(ProKey *)in_stack_fffffffffffff6e0);
                if (bVar1) {
                  memset(local_5f0,0xaa,0x30);
                  local_600 = ::operator+((QString *)in_stack_fffffffffffff6d0,
                                          (char (*) [8])in_stack_fffffffffffff6c8);
                  ProKey::ProKey<QString&,char_const(&)[8]>
                            ((ProKey *)in_stack_fffffffffffff6d0,
                             (QStringBuilder<QString_&,_const_char_(&)[8]> *)
                             in_stack_fffffffffffff6c8);
                  bVar1 = QMakeProject::isEmpty
                                    (in_stack_fffffffffffff6e8,(ProKey *)in_stack_fffffffffffff6e0);
                  if (!bVar1) {
                    QMakeEvaluator::first
                              (&in_stack_fffffffffffff6e8->super_QMakeEvaluator,
                               (ProKey *)in_stack_fffffffffffff6e0);
                    ProString::toQString((ProString *)in_stack_fffffffffffff6c8);
                    QString::operator=((QString *)in_stack_fffffffffffff6d0,
                                       &in_stack_fffffffffffff6c8->name);
                    QString::~QString((QString *)0x199e21);
                    ProString::~ProString((ProString *)0x199e2e);
                  }
                  ProKey::~ProKey((ProKey *)0x199e3b);
                }
                else {
                  QMakeEvaluator::first
                            (&in_stack_fffffffffffff6e8->super_QMakeEvaluator,
                             (ProKey *)in_stack_fffffffffffff6e0);
                  ProString::toQString((ProString *)in_stack_fffffffffffff6c8);
                  QString::operator=((QString *)in_stack_fffffffffffff6d0,
                                     &in_stack_fffffffffffff6c8->name);
                  QString::~QString((QString *)0x199d44);
                  ProString::~ProString((ProString *)0x199d51);
                }
                QString::QString((QString *)in_stack_fffffffffffff6d8,
                                 (char *)in_stack_fffffffffffff708);
                QFlags<QRegularExpression::PatternOption>::QFlags
                          ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffff6d0,
                           (PatternOption)((ulong)in_stack_fffffffffffff6c8 >> 0x20));
                QRegularExpression::QRegularExpression
                          (local_690,(QString *)local_6a8,(QFlags_conflict *)(ulong)local_6ac);
                QString::QString((QString *)in_stack_fffffffffffff6d8,
                                 (char *)in_stack_fffffffffffff708);
                QString::replace((QRegularExpression *)&local_538,(QString *)local_690);
                local_688 = ::operator+((char (*) [5])in_stack_fffffffffffff6d0,
                                        &in_stack_fffffffffffff6c8->name);
                ProString::ProString<char_const(&)[5],QString&>
                          (in_stack_fffffffffffff6e0,
                           (QStringBuilder<const_char_(&)[5],_QString_&> *)in_stack_fffffffffffff6d8
                          );
                QList<ProString>::operator+=
                          ((QList<ProString> *)in_stack_fffffffffffff6d0,
                           (rvalue_ref)in_stack_fffffffffffff6c8);
                ProString::~ProString((ProString *)0x199f08);
                QString::~QString((QString *)0x199f15);
                QRegularExpression::~QRegularExpression(local_690);
                QString::~QString((QString *)0x199f2f);
                ProKey::~ProKey((ProKey *)0x199f3c);
                QString::~QString((QString *)0x199f49);
              }
              else {
                QMakeEvaluator::first
                          (&in_stack_fffffffffffff6e8->super_QMakeEvaluator,
                           (ProKey *)in_stack_fffffffffffff6e0);
                QList<ProString>::operator+=
                          ((QList<ProString> *)in_stack_fffffffffffff6d0,
                           (rvalue_ref)in_stack_fffffffffffff6c8);
                ProString::~ProString((ProString *)0x199c2b);
              }
              bVar1 = true;
              ProKey::~ProKey((ProKey *)0x199f69);
              QString::~QString((QString *)0x199f76);
              QString::~QString((QString *)0x199f83);
              break;
            }
            local_89c = local_89c + 1;
          }
          if (!bVar1) {
            local_6e0 = 0xaaaaaaaaaaaaaaaa;
            local_6d8 = 0xaaaaaaaaaaaaaaaa;
            local_6d0 = 0xaaaaaaaaaaaaaaaa;
            QList<ProString>::at
                      ((QList<ProString> *)in_stack_fffffffffffff6d0,
                       (qsizetype)in_stack_fffffffffffff6c8);
            ProString::toQString((ProString *)in_stack_fffffffffffff6c8);
            QString::QString((QString *)in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff708)
            ;
            QFlags<QRegularExpression::PatternOption>::QFlags
                      ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffff6d0,
                       (PatternOption)((ulong)in_stack_fffffffffffff6c8 >> 0x20));
            QRegularExpression::QRegularExpression
                      (local_718,(QString *)local_730,(QFlags_conflict *)(ulong)local_734);
            QString::QString((QString *)in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff708)
            ;
            QString::replace((QRegularExpression *)&local_6e0,(QString *)local_718);
            ProString::ProString
                      ((ProString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name);
            QList<ProString>::operator+=
                      ((QList<ProString> *)in_stack_fffffffffffff6d0,
                       (rvalue_ref)in_stack_fffffffffffff6c8);
            ProString::~ProString((ProString *)0x19a0a6);
            QString::~QString((QString *)0x19a0b3);
            QRegularExpression::~QRegularExpression(local_718);
            QString::~QString((QString *)0x19a0cd);
            QString::~QString((QString *)0x19a0da);
          }
          local_894 = local_894 + 1;
        }
      }
      memset(local_780,0xaa,0x30);
      local_790 = ::operator+((QString *)in_stack_fffffffffffff6d0,
                              (char (*) [8])in_stack_fffffffffffff6c8);
      ProKey::ProKey<QString&,char_const(&)[8]>
                ((ProKey *)in_stack_fffffffffffff6d0,
                 (QStringBuilder<QString_&,_const_char_(&)[8]> *)in_stack_fffffffffffff6c8);
      bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff6e8,(ProKey *)in_stack_fffffffffffff6e0);
      if (bVar1) {
        local_800 = ::operator+((char (*) [5])in_stack_fffffffffffff6d0,
                                &in_stack_fffffffffffff6c8->name);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<const_char_(&)[5],_QString_&> *)in_stack_fffffffffffff6c8);
        QString::operator=((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name);
        QString::~QString((QString *)0x19a234);
        in_stack_fffffffffffff6c8 = (parameter_type)(this_01 + 4);
        QString::QString((QString *)in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff708);
        QFlags<QRegularExpression::PatternOption>::QFlags
                  ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffff6d0,
                   (PatternOption)((ulong)in_stack_fffffffffffff6c8 >> 0x20));
        QRegularExpression::QRegularExpression
                  (local_808,(QString *)local_820,(QFlags_conflict *)(ulong)local_824);
        QString::QString((QString *)in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff708);
        QString::replace((QRegularExpression *)in_stack_fffffffffffff6c8,(QString *)local_808);
        QString::~QString((QString *)0x19a2bd);
        QRegularExpression::~QRegularExpression(local_808);
        QString::~QString((QString *)0x19a2d7);
      }
      else {
        QMakeEvaluator::first
                  (&in_stack_fffffffffffff6e8->super_QMakeEvaluator,
                   (ProKey *)in_stack_fffffffffffff6e0);
        ProString::toQString((ProString *)in_stack_fffffffffffff6c8);
        QString::operator=((QString *)in_stack_fffffffffffff6d0,&in_stack_fffffffffffff6c8->name);
        QString::~QString((QString *)0x19a1c3);
        ProString::~ProString((ProString *)0x19a1d0);
      }
      ProKey::~ProKey((ProKey *)0x19a2e4);
      ProKey::~ProKey((ProKey *)0x19a2f1);
      ProKey::~ProKey((ProKey *)0x19a2fe);
      in_stack_fffffffffffff780 = 0;
    }
    QString::~QString((QString *)0x19a316);
    ProKey::~ProKey((ProKey *)0x19a323);
    ProKey::~ProKey((ProKey *)0x19a330);
    QString::~QString((QString *)0x19a33d);
    QString::~QString((QString *)0x19a34a);
    ProString::~ProString((ProString *)0x19a357);
    local_864 = local_864 + 1;
  } while( true );
}

Assistant:

QList<MakefileGenerator::SubTarget*>
MakefileGenerator::findSubDirsSubTargets() const
{
    QList<SubTarget*> targets;
    {
        const ProStringList &subdirs = project->values("SUBDIRS");
        for(int subdir = 0; subdir < subdirs.size(); ++subdir) {
            ProString ofile = subdirs[subdir];
            QString oname = ofile.toQString();
            QString fixedSubdir = oname;
            fixedSubdir.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");

            SubTarget *st = new SubTarget;
            st->name = oname;
            targets.append(st);

            bool fromFile = false;
            const ProKey fkey(fixedSubdir + ".file");
            const ProKey skey(fixedSubdir + ".subdir");
            if (!project->isEmpty(fkey)) {
                if (!project->isEmpty(skey))
                    warn_msg(WarnLogic, "Cannot assign both file and subdir for subdir %s",
                             subdirs[subdir].toLatin1().constData());
                ofile = project->first(fkey);
                fromFile = true;
            } else if (!project->isEmpty(skey)) {
                ofile = project->first(skey);
                fromFile = false;
            } else {
                fromFile = ofile.endsWith(Option::pro_ext);
            }
            QString file = Option::fixPathToTargetOS(ofile.toQString());

            if(fromFile) {
                int slsh = file.lastIndexOf(Option::dir_sep);
                if(slsh != -1) {
                    st->in_directory = file.left(slsh+1);
                    st->profile = file.mid(slsh+1);
                } else {
                    st->profile = file;
                }
            } else {
                if (!file.isEmpty() && !project->isActiveConfig("subdir_first_pro")) {
                    const QString baseName = file.section(Option::dir_sep, -1);
                    if (baseName.isEmpty()) {
                        warn_msg(WarnLogic, "Ignoring invalid SUBDIRS entry %s",
                                 subdirs[subdir].toLatin1().constData());
                        continue;
                    }
                    st->profile = baseName + Option::pro_ext;
                }
                st->in_directory = file;
            }
            while(st->in_directory.endsWith(Option::dir_sep))
                st->in_directory.chop(1);
            if(fileInfo(st->in_directory).isRelative())
                st->out_directory = st->in_directory;
            else
                st->out_directory = fileFixify(st->in_directory, FileFixifyBackwards);
            const ProKey mkey(fixedSubdir + ".makefile");
            if (!project->isEmpty(mkey)) {
                st->makefile = project->first(mkey).toQString();
            } else {
                st->makefile = "Makefile";
                if(!st->profile.isEmpty()) {
                    QString basename = st->in_directory;
                    int new_slsh = basename.lastIndexOf(Option::dir_sep);
                    if(new_slsh != -1)
                        basename = basename.mid(new_slsh+1);
                    if(st->profile != basename + Option::pro_ext)
                        st->makefile += "." + st->profile.left(st->profile.size() - Option::pro_ext.size());
                }
            }
            const ProKey dkey(fixedSubdir + ".depends");
            if (!project->isEmpty(dkey)) {
                const ProStringList &depends = project->values(dkey);
                for(int depend = 0; depend < depends.size(); ++depend) {
                    bool found = false;
                    for(int subDep = 0; subDep < subdirs.size(); ++subDep) {
                        if(subdirs[subDep] == depends.at(depend)) {
                            QString subName = subdirs[subDep].toQString();
                            QString fixedSubDep = subName;
                            fixedSubDep.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");
                            const ProKey dtkey(fixedSubDep + ".target");
                            if (!project->isEmpty(dtkey)) {
                                st->depends += project->first(dtkey);
                            } else {
                                QString d = Option::fixPathToTargetOS(subName);
                                const ProKey dfkey(fixedSubDep + ".file");
                                if (!project->isEmpty(dfkey)) {
                                    d = project->first(dfkey).toQString();
                                } else {
                                    const ProKey dskey(fixedSubDep + ".subdir");
                                    if (!project->isEmpty(dskey))
                                        d = project->first(dskey).toQString();
                                }
                                st->depends += "sub-" + d.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");
                            }
                            found = true;
                            break;
                        }
                    }
                    if(!found) {
                        QString depend_str = depends.at(depend).toQString();
                        st->depends += depend_str.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");
                    }
                }
            }
            const ProKey tkey(fixedSubdir + ".target");
            if (!project->isEmpty(tkey)) {
                st->target = project->first(tkey).toQString();
            } else {
                st->target = "sub-" + file;
                st->target.replace(QRegularExpression("[^a-zA-Z0-9_]"), "-");
            }
        }
    }
    return targets;
}